

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_utility.cpp
# Opt level: O2

HexDataStruct *
cfd::js::api::UtilStructApi::DecodeBase64
          (HexDataStruct *__return_storage_ptr__,Base64DataStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&)> local_f8;
  HexDataStruct local_d8;
  
  HexDataStruct::HexDataStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_utility.cpp:137:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_utility.cpp:137:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"DecodeBase64",&local_119);
  ExecuteStructApi<cfd::js::api::Base64DataStruct,cfd::js::api::HexDataStruct>
            (&local_d8,(api *)request,(Base64DataStruct *)&local_118,&local_f8,in_R8);
  HexDataStruct::operator=(__return_storage_ptr__,&local_d8);
  HexDataStruct::~HexDataStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

HexDataStruct UtilStructApi::DecodeBase64(const Base64DataStruct& request) {
  auto call_func = [](const Base64DataStruct& request) -> HexDataStruct {
    HexDataStruct result;
    ByteData data = CryptoUtil::DecodeBase64(request.base64);
    if ((!request.base64.empty()) && data.IsEmpty()) {
      warn(CFD_LOG_SOURCE, "Failed to parameter. Decode base64 error.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Decode base64 error.");
    }
    result.hex = data.GetHex();
    return result;
  };

  HexDataStruct result;
  result = ExecuteStructApi<Base64DataStruct, HexDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}